

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O0

int __thiscall QStackedLayout::insertWidget(QStackedLayout *this,int index,QWidget *widget)

{
  ulong uVar1;
  long lVar2;
  int index_00;
  QStackedLayoutPrivate *pQVar3;
  Promoted<int,_long_long> PVar4;
  qsizetype qVar5;
  QWidgetItem *t;
  iterator this_00;
  QWidget *in_RDX;
  QLayout *in_RDI;
  long in_FS_OFFSET;
  QStackedLayout *unaff_retaddr;
  QWidgetItem *wi;
  QStackedLayoutPrivate *d;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QLayout *this_01;
  qsizetype local_18;
  int local_c [2];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar3 = d_func((QStackedLayout *)0x34fbe3);
  QLayout::addChildWidget(this_01,in_RDX);
  local_18 = QList<QLayoutItem_*>::size(&pQVar3->list);
  PVar4 = qMin<int,long_long>(local_c,&local_18);
  local_c[0] = (int)PVar4;
  if (local_c[0] < 0) {
    qVar5 = QList<QLayoutItem_*>::size(&pQVar3->list);
    local_c[0] = (int)qVar5;
  }
  t = QLayoutPrivate::createWidgetItem
                (in_RDI,(QWidget *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  this_00 = QList<QLayoutItem_*>::insert
                      ((QList<QLayoutItem_*> *)in_RDI,
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       &t->super_QLayoutItem);
  (**(code **)(*(long *)in_RDI + 0x70))();
  lVar2 = stack0xfffffffffffffff8;
  if (pQVar3->index < 0) {
    uVar1 = (ulong)stack0xfffffffffffffff8 >> 0x20;
    index_00 = (int)uVar1;
    unique0x1000020d = lVar2;
    setCurrentIndex(unaff_retaddr,index_00);
  }
  else {
    if (local_c[0] <= pQVar3->index) {
      pQVar3->index = pQVar3->index + 1;
    }
    if (pQVar3->stackingMode == StackOne) {
      QWidget::hide((QWidget *)0x34fcd6);
    }
    QWidget::lower((QWidget *)this_00.i);
  }
  widgetAdded((QStackedLayout *)0x34fcee,in_stack_ffffffffffffffac);
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff8) {
    return local_c[0];
  }
  __stack_chk_fail();
}

Assistant:

int QStackedLayout::insertWidget(int index, QWidget *widget)
{
    Q_D(QStackedLayout);
    addChildWidget(widget);
    index = qMin(index, d->list.size());
    if (index < 0)
        index = d->list.size();
    QWidgetItem *wi = QLayoutPrivate::createWidgetItem(this, widget);
    d->list.insert(index, wi);
    invalidate();
    if (d->index < 0) {
        setCurrentIndex(index);
    } else {
        if (index <= d->index)
            ++d->index;
        if (d->stackingMode == StackOne)
            widget->hide();
        widget->lower();
    }
    emit widgetAdded(index);
    return index;
}